

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

wstring * __thiscall
PDA::Transducer::Token::vectorToWString_abi_cxx11_
          (wstring *__return_storage_ptr__,Token *this,
          vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *src)

{
  bool bVar1;
  reference pTVar2;
  Token *token;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *__range2;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *src_local;
  wstring *result;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  __end2 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::begin(this)
  ;
  token = (Token *)std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::end
                             ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                               *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_PDA::Transducer::Token_*,_std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>_>
                                     *)&token), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_PDA::Transducer::Token_*,_std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>_>
             ::operator*(&__end2);
    std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,pTVar2->token);
    __gnu_cxx::
    __normal_iterator<const_PDA::Transducer::Token_*,_std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Token::vectorToWString(const std::vector<Token> &src)
{
    std::wstring result;
    for (const Token &token : src)
        result += token.token;
    return result;
}